

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc2.c
# Opt level: O0

void Saig_BmcDeriveFailed(Saig_Bmc_t *p,int iTargetFail)

{
  int iVar1;
  int local_18;
  int k;
  int iTargetFail_local;
  Saig_Bmc_t *p_local;
  
  p->iOutputFail = p->iOutputLast;
  p->iFrameFail = p->iFrameLast;
  for (local_18 = Vec_PtrSize(p->vTargets); iTargetFail < local_18; local_18 = local_18 + -1) {
    if (p->iOutputFail == 0) {
      iVar1 = Saig_ManPoNum(p->pAig);
      p->iOutputFail = iVar1;
      p->iFrameFail = p->iFrameFail + -1;
    }
    p->iOutputFail = p->iOutputFail + -1;
  }
  return;
}

Assistant:

void Saig_BmcDeriveFailed( Saig_Bmc_t * p, int iTargetFail )
{
    int k;
    p->iOutputFail = p->iOutputLast;
    p->iFrameFail  = p->iFrameLast;
    for ( k = Vec_PtrSize(p->vTargets); k > iTargetFail; k-- )
    {
        if ( p->iOutputFail == 0 )
        {
            p->iOutputFail = Saig_ManPoNum(p->pAig);
            p->iFrameFail--;
        }
        p->iOutputFail--;
    }
}